

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
despot::Variable::ComputeIndexVec
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *vars,int index)

{
  pointer piVar1;
  pointer ppNVar2;
  NamedVar *pNVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(vars->
                   super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(vars->
                   super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_19);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (int)((ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2) - 1;
  if (-1 < (int)uVar4) {
    ppNVar2 = (vars->super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (ulong)uVar4;
    do {
      pNVar3 = ppNVar2[uVar5];
      iVar6 = (int)((ulong)((long)*(pointer *)
                                   ((long)&(pNVar3->super_Variable).values_.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   + 8) -
                           *(long *)&(pNVar3->super_Variable).values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data) >> 5);
      piVar1[uVar5] = index % iVar6;
      bVar7 = uVar5 != 0;
      uVar5 = uVar5 - 1;
      index = index / iVar6;
    } while (bVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Variable::ComputeIndexVec(const vector<NamedVar*>& vars,
	int index) {
	vector<int> vec(vars.size());
	for (int i = vec.size() - 1; i >= 0; i--) {
		vec[i] = index % vars[i]->Size();
		index /= vars[i]->Size();
	}

	return vec;
}